

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O0

word zzModW2(word *a,size_t n,word w)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong uVar12;
  word b;
  dword r1;
  word r0;
  word w_local;
  size_t n_local;
  word *a_local;
  
  auVar9 = ZEXT816(0);
  uVar12 = -w % w;
  n_local = n;
  while (r1._0_8_ = auVar9._8_8_, r0 = auVar9._0_8_, auVar10._8_8_ = 0, auVar10._0_8_ = r0,
        n_local != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (ulong)r1;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar12;
    auVar10 = auVar1 * auVar5 + auVar10;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = auVar10._0_8_;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar12;
    auVar9._8_8_ = auVar10._8_8_ * uVar12;
    auVar9._0_8_ = a[n_local - 1];
    auVar9 = auVar2 * auVar6 + auVar9;
    n_local = n_local - 1;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (ulong)r1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar12;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = r0 % w;
  auVar11 = auVar3 * auVar7 + auVar11;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = auVar11._8_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar12;
  return (SUB168(auVar4 * auVar8,0) + auVar11._0_8_ % w) % w;
}

Assistant:

word zzModW2(const word a[], size_t n, register word w)
{
	register word r0 = 0;
	register dword r1 = 0;
	register word b;
	// pre
	ASSERT(w > 0);
	ASSERT(w <= WORD_BIT_HALF);
	ASSERT(wwIsValid(a, n));
	// b <- B \mod mod
	b = (WORD_MAX - w + 1) % w;
	// (r1 r0) <- \sum_i a[i] b^i
	while (n--)
	{
		r1 *= b;
		r1 += r0;
		r1 *= b;
		r1 += a[n];
		r0 = (word)r1;
		r1 >>= B_PER_W;
	}
	// нормализация
#ifdef SAFE_FAST
	while (r1 != 0)
	{
		r1 *= b;
		r1 += r0 % w;
		r0 = (word)r1;
		r1 >>= B_PER_W;
	}
	r0 %= w;
#else
	r1 *= b;
	r1 += r0 % w;
	r0 = (word)r1;
	r1 >>= B_PER_W;
	r1 *= b;
	r1 += r0 % w;
	r0 = (word)r1 % w;
#endif
	// очистка и возврат
	r1 = 0, b = w = 0;
	return r0;
}